

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_credential.cc
# Opt level: O2

int SSL_CREDENTIAL_set1_cert_chain(SSL_CREDENTIAL *cred,CRYPTO_BUFFER **certs,size_t num_certs)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  uint uVar4;
  unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> local_40;
  bssl local_38 [8];
  
  bVar2 = ssl_credential_st::UsesX509(cred);
  if (num_certs == 0 || !bVar2) {
    uVar4 = 0;
    ERR_put_error(0x10,0,0x42,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_credential.cc"
                  ,0x17c);
  }
  else {
    bssl::UpRef((bssl *)&local_40,*certs);
    uVar4 = 0;
    bVar2 = ssl_credential_st::SetLeafCert(cred,(UniquePtr<CRYPTO_BUFFER> *)&local_40,false);
    std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&local_40);
    if (bVar2) {
      ssl_credential_st::ClearIntermediateCerts(cred);
      uVar1 = 1;
      do {
        uVar3 = uVar1;
        if (num_certs == uVar3) break;
        bssl::UpRef(local_38,certs[uVar3]);
        bVar2 = ssl_credential_st::AppendIntermediateCert(cred,(UniquePtr<CRYPTO_BUFFER> *)local_38)
        ;
        std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)local_38);
        uVar1 = uVar3 + 1;
      } while (bVar2);
      uVar4 = (uint)(num_certs <= uVar3);
    }
  }
  return uVar4;
}

Assistant:

int SSL_CREDENTIAL_set1_cert_chain(SSL_CREDENTIAL *cred,
                                   CRYPTO_BUFFER *const *certs,
                                   size_t num_certs) {
  if (!cred->UsesX509() || num_certs == 0) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return 0;
  }

  if (!cred->SetLeafCert(UpRef(certs[0]), /*discard_key_on_mismatch=*/false)) {
    return 0;
  }

  cred->ClearIntermediateCerts();
  for (size_t i = 1; i < num_certs; i++) {
    if (!cred->AppendIntermediateCert(UpRef(certs[i]))) {
      return 0;
    }
  }

  return 1;
}